

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PoslistMerge(char **pp,char **pp1,char **pp2)

{
  int iVar1;
  bool bVar2;
  bool local_71;
  sqlite3_int64 local_70;
  long lStack_60;
  int n;
  sqlite3_int64 iPrev;
  sqlite3_int64 i2;
  sqlite3_int64 i1;
  int iCol2;
  int iCol1;
  char *p2;
  char *p1;
  char *p;
  char **pp2_local;
  char **pp1_local;
  char **pp_local;
  
  p1 = *pp;
  p2 = *pp1;
  _iCol2 = *pp2;
  p = (char *)pp2;
  pp2_local = pp1;
  pp1_local = pp;
  do {
    bVar2 = true;
    if (*p2 == '\0') {
      bVar2 = *_iCol2 != '\0';
    }
    if (!bVar2) {
      *p1 = '\0';
      *pp1_local = p1 + 1;
      *pp2_local = p2 + 1;
      *(char **)p = _iCol2 + 1;
      return 0;
    }
    if (*p2 == '\x01') {
      if ((p2[1] & 0x80U) == 0) {
        i1._4_4_ = (uint)(byte)p2[1];
      }
      else {
        sqlite3Fts3GetVarint32(p2 + 1,(int *)((long)&i1 + 4));
      }
      if (i1._4_4_ == 0) {
        return 0x10b;
      }
    }
    else if (*p2 == '\0') {
      i1._4_4_ = 0x7fffffff;
    }
    else {
      i1._4_4_ = 0;
    }
    if (*_iCol2 == '\x01') {
      if ((_iCol2[1] & 0x80U) == 0) {
        i1._0_4_ = (uint)(byte)_iCol2[1];
      }
      else {
        sqlite3Fts3GetVarint32(_iCol2 + 1,(int *)&i1);
      }
      if ((uint)i1 == 0) {
        return 0x10b;
      }
    }
    else if (*_iCol2 == '\0') {
      i1._0_4_ = 0x7fffffff;
    }
    else {
      i1._0_4_ = 0;
    }
    if (i1._4_4_ == (uint)i1) {
      i2 = 0;
      iPrev = 0;
      lStack_60 = 0;
      iVar1 = fts3PutColNumber(&p1,i1._4_4_);
      p2 = p2 + iVar1;
      _iCol2 = _iCol2 + iVar1;
      fts3GetDeltaVarint(&p2,&i2);
      fts3GetDeltaVarint((char **)&iCol2,&iPrev);
      do {
        if (i2 < iPrev) {
          local_70 = i2;
        }
        else {
          local_70 = iPrev;
        }
        fts3PutDeltaVarint(&p1,&stack0xffffffffffffffa0,local_70);
        lStack_60 = lStack_60 + -2;
        if (i2 == iPrev) {
          fts3ReadNextPos(&p2,&i2);
          fts3ReadNextPos((char **)&iCol2,&iPrev);
        }
        else if (i2 < iPrev) {
          fts3ReadNextPos(&p2,&i2);
        }
        else {
          fts3ReadNextPos((char **)&iCol2,&iPrev);
        }
        local_71 = i2 != 0x7fffffff || iPrev != 0x7fffffff;
      } while (local_71);
    }
    else if ((int)i1._4_4_ < (int)(uint)i1) {
      iVar1 = fts3PutColNumber(&p1,i1._4_4_);
      p2 = p2 + iVar1;
      fts3ColumnlistCopy(&p1,&p2);
    }
    else {
      iVar1 = fts3PutColNumber(&p1,(uint)i1);
      _iCol2 = _iCol2 + iVar1;
      fts3ColumnlistCopy(&p1,(char **)&iCol2);
    }
  } while( true );
}

Assistant:

static int fts3PoslistMerge(
  char **pp,                      /* Output buffer */
  char **pp1,                     /* Left input list */
  char **pp2                      /* Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;

  while( *p1 || *p2 ){
    int iCol1;         /* The current column index in pp1 */
    int iCol2;         /* The current column index in pp2 */

    if( *p1==POS_COLUMN ){ 
      fts3GetVarint32(&p1[1], &iCol1);
      if( iCol1==0 ) return FTS_CORRUPT_VTAB;
    }
    else if( *p1==POS_END ) iCol1 = POSITION_LIST_END;
    else iCol1 = 0;

    if( *p2==POS_COLUMN ){
      fts3GetVarint32(&p2[1], &iCol2);
      if( iCol2==0 ) return FTS_CORRUPT_VTAB;
    }
    else if( *p2==POS_END ) iCol2 = POSITION_LIST_END;
    else iCol2 = 0;

    if( iCol1==iCol2 ){
      sqlite3_int64 i1 = 0;       /* Last position from pp1 */
      sqlite3_int64 i2 = 0;       /* Last position from pp2 */
      sqlite3_int64 iPrev = 0;
      int n = fts3PutColNumber(&p, iCol1);
      p1 += n;
      p2 += n;

      /* At this point, both p1 and p2 point to the start of column-lists
      ** for the same column (the column with index iCol1 and iCol2).
      ** A column-list is a list of non-negative delta-encoded varints, each 
      ** incremented by 2 before being stored. Each list is terminated by a
      ** POS_END (0) or POS_COLUMN (1). The following block merges the two lists
      ** and writes the results to buffer p. p is left pointing to the byte
      ** after the list written. No terminator (POS_END or POS_COLUMN) is
      ** written to the output.
      */
      fts3GetDeltaVarint(&p1, &i1);
      fts3GetDeltaVarint(&p2, &i2);
      do {
        fts3PutDeltaVarint(&p, &iPrev, (i1<i2) ? i1 : i2); 
        iPrev -= 2;
        if( i1==i2 ){
          fts3ReadNextPos(&p1, &i1);
          fts3ReadNextPos(&p2, &i2);
        }else if( i1<i2 ){
          fts3ReadNextPos(&p1, &i1);
        }else{
          fts3ReadNextPos(&p2, &i2);
        }
      }while( i1!=POSITION_LIST_END || i2!=POSITION_LIST_END );
    }else if( iCol1<iCol2 ){
      p1 += fts3PutColNumber(&p, iCol1);
      fts3ColumnlistCopy(&p, &p1);
    }else{
      p2 += fts3PutColNumber(&p, iCol2);
      fts3ColumnlistCopy(&p, &p2);
    }
  }

  *p++ = POS_END;
  *pp = p;
  *pp1 = p1 + 1;
  *pp2 = p2 + 1;
  return SQLITE_OK;
}